

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_pixarlog.c
# Opt level: O3

int PixarLogGuessDataFmt(TIFFDirectory *td)

{
  uint uVar1;
  int iVar2;
  short in_SI;
  
  uVar1 = (uint)td & 0xffff;
  iVar2 = -1;
  switch(uVar1) {
  case 8:
    iVar2 = -(uint)(in_SI != 1 && in_SI != 4);
    break;
  case 9:
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
    break;
  case 0xb:
    return -(uint)(in_SI != 1 && in_SI != 4) | 2;
  case 0xc:
    return -(uint)((in_SI - 2U & 0xfffd) != 0) | 3;
  case 0x10:
    return -(uint)(in_SI != 1 && in_SI != 4) | 4;
  default:
    if (uVar1 == 0x20) {
      return -(uint)(in_SI != 3) | 5;
    }
  }
  return iVar2;
}

Assistant:

static int PixarLogGuessDataFmt(TIFFDirectory *td)
{
    int guess = PIXARLOGDATAFMT_UNKNOWN;
    int format = td->td_sampleformat;

    /* If the user didn't tell us his datafmt,
     * take our best guess from the bitspersample.
     */
    switch (td->td_bitspersample)
    {
        case 32:
            if (format == SAMPLEFORMAT_IEEEFP)
                guess = PIXARLOGDATAFMT_FLOAT;
            break;
        case 16:
            if (format == SAMPLEFORMAT_VOID || format == SAMPLEFORMAT_UINT)
                guess = PIXARLOGDATAFMT_16BIT;
            break;
        case 12:
            if (format == SAMPLEFORMAT_VOID || format == SAMPLEFORMAT_INT)
                guess = PIXARLOGDATAFMT_12BITPICIO;
            break;
        case 11:
            if (format == SAMPLEFORMAT_VOID || format == SAMPLEFORMAT_UINT)
                guess = PIXARLOGDATAFMT_11BITLOG;
            break;
        case 8:
            if (format == SAMPLEFORMAT_VOID || format == SAMPLEFORMAT_UINT)
                guess = PIXARLOGDATAFMT_8BIT;
            break;
    }

    return guess;
}